

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

weak_ptr<cppcms::application_specific_pool> __thiscall
cppcms::application::get_pool(application *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  weak_ptr<cppcms::application_specific_pool> wVar1;
  
  std::__weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)(in_RSI + 8) + 0x48));
  wVar1.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  wVar1.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<cppcms::application_specific_pool>)
         wVar1.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::weak_ptr<application_specific_pool> application::get_pool()
{
	return d->my_pool;
}